

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

void term_size(Terminal *term,wchar_t newrows,wchar_t newcols,wchar_t newsavelines)

{
  wchar_t wVar1;
  wchar_t which;
  wchar_t wVar2;
  int index;
  wchar_t wVar3;
  tree234 *ptVar4;
  compressed_scrollback_line *pcVar5;
  termline *ptVar6;
  void *ptr;
  termline **pptVar7;
  uchar *puVar8;
  wchar_t local_7c;
  wchar_t local_5c;
  wchar_t i_1;
  compressed_scrollback_line *cline;
  wchar_t local_48;
  wchar_t save_alt_which;
  wchar_t sblen;
  wchar_t oldrows;
  wchar_t j;
  wchar_t i;
  termline *line;
  termline **newdisp;
  tree234 *newalt;
  wchar_t local_18;
  wchar_t newsavelines_local;
  wchar_t newcols_local;
  wchar_t newrows_local;
  Terminal *term_local;
  
  wVar1 = term->rows;
  which = term->alt_which;
  if (((newrows != term->rows) || (newcols != term->cols)) || (newsavelines != term->savelines)) {
    newsavelines_local = newrows;
    if (newrows < L'\x01') {
      newsavelines_local = L'\x01';
    }
    local_18 = newcols;
    if (newcols < L'\x01') {
      local_18 = L'\x01';
    }
    deselect(term);
    swap_screen(term,L'\0',false,false);
    term->marg_t = L'\0';
    term->alt_t = L'\0';
    term->marg_b = newsavelines_local + L'\xffffffff';
    term->alt_b = newsavelines_local + L'\xffffffff';
    if (term->rows == L'\xffffffff') {
      ptVar4 = newtree234((cmpfn234)0x0);
      term->scrollback = ptVar4;
      ptVar4 = newtree234((cmpfn234)0x0);
      term->screen = ptVar4;
      term->tempsblines = L'\0';
      term->rows = L'\0';
    }
    local_48 = count234(term->scrollback);
    wVar3 = term->rows;
    wVar2 = count234(term->screen);
    if (wVar3 != wVar2) {
      __assert_fail("term->rows == count234(term->screen)",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                    ,0x88d,"void term_size(Terminal *, int, int, int)");
    }
    while (term->rows < newsavelines_local) {
      if (term->tempsblines < L'\x01') {
        ptVar6 = newtermline(term,local_18,false);
        ptVar4 = term->screen;
        index = count234(term->screen);
        addpos234(ptVar4,ptVar6,index);
      }
      else {
        if (local_48 < term->tempsblines) {
          __assert_fail("sblen >= term->tempsblines",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                        ,0x892,"void term_size(Terminal *, int, int, int)");
        }
        local_48 = local_48 + L'\xffffffff';
        pcVar5 = (compressed_scrollback_line *)delpos234(term->scrollback,local_48);
        ptVar6 = decompressline(pcVar5);
        safefree(pcVar5);
        ptVar6->temporary = false;
        term->tempsblines = term->tempsblines + L'\xffffffff';
        addpos234(term->screen,ptVar6,0);
        (term->curs).y = (term->curs).y + L'\x01';
        (term->savecurs).y = (term->savecurs).y + L'\x01';
        term->alt_y = term->alt_y + L'\x01';
        (term->alt_savecurs).y = (term->alt_savecurs).y + L'\x01';
      }
      term->rows = term->rows + L'\x01';
    }
    while (newsavelines_local < term->rows) {
      if ((term->curs).y < term->rows + L'\xffffffff') {
        ptVar6 = (termline *)delpos234(term->screen,term->rows + L'\xffffffff');
        freetermline(ptVar6);
      }
      else {
        ptVar6 = (termline *)delpos234(term->screen,0);
        ptVar4 = term->scrollback;
        pcVar5 = compressline(ptVar6);
        addpos234(ptVar4,pcVar5,local_48);
        freetermline(ptVar6);
        term->tempsblines = term->tempsblines + L'\x01';
        (term->curs).y = (term->curs).y + L'\xffffffff';
        (term->savecurs).y = (term->savecurs).y + L'\xffffffff';
        term->alt_y = term->alt_y + L'\xffffffff';
        (term->alt_savecurs).y = (term->alt_savecurs).y + L'\xffffffff';
        local_48 = local_48 + L'\x01';
      }
      term->rows = term->rows + L'\xffffffff';
    }
    if (term->rows != newsavelines_local) {
      __assert_fail("term->rows == newrows",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                    ,0x8b7,"void term_size(Terminal *, int, int, int)");
    }
    wVar3 = count234(term->screen);
    if (wVar3 != newsavelines_local) {
      __assert_fail("count234(term->screen) == newrows",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                    ,0x8b8,"void term_size(Terminal *, int, int, int)");
    }
    for (; newsavelines < local_48; local_48 = local_48 + L'\xffffffff') {
      ptr = delpos234(term->scrollback,0);
      safefree(ptr);
    }
    if (local_48 < term->tempsblines) {
      term->tempsblines = local_48;
    }
    wVar3 = count234(term->scrollback);
    if (newsavelines < wVar3) {
      __assert_fail("count234(term->scrollback) <= newsavelines",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                    ,0x8c2,"void term_size(Terminal *, int, int, int)");
    }
    wVar3 = count234(term->scrollback);
    if (wVar3 < term->tempsblines) {
      __assert_fail("count234(term->scrollback) >= term->tempsblines",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                    ,0x8c3,"void term_size(Terminal *, int, int, int)");
    }
    term->disptop = L'\0';
    pptVar7 = (termline **)safemalloc((long)newsavelines_local,8,0);
    for (oldrows = L'\0'; oldrows < newsavelines_local; oldrows = oldrows + L'\x01') {
      ptVar6 = newtermline(term,local_18,false);
      pptVar7[oldrows] = ptVar6;
      for (sblen = L'\0'; sblen < local_18; sblen = sblen + L'\x01') {
        pptVar7[oldrows]->chars[sblen].attr = 0x3ffff;
      }
    }
    if (term->disptext != (termline **)0x0) {
      for (oldrows = L'\0'; oldrows < wVar1; oldrows = oldrows + L'\x01') {
        freetermline(term->disptext[oldrows]);
      }
    }
    safefree(term->disptext);
    term->disptext = pptVar7;
    term->dispcursy = L'\xffffffff';
    term->dispcursx = L'\xffffffff';
    ptVar4 = newtree234((cmpfn234)0x0);
    for (oldrows = L'\0'; oldrows < newsavelines_local; oldrows = oldrows + L'\x01') {
      ptVar6 = newtermline(term,local_18,true);
      addpos234(ptVar4,ptVar6,oldrows);
    }
    if (term->alt_screen != (tree234 *)0x0) {
      while (ptVar6 = (termline *)delpos234(term->alt_screen,0), ptVar6 != (termline *)0x0) {
        freetermline(ptVar6);
      }
      freetree234(term->alt_screen);
    }
    term->alt_screen = ptVar4;
    term->alt_sblines = L'\0';
    puVar8 = (uchar *)saferealloc(term->tabs,(long)local_18,1);
    term->tabs = puVar8;
    if (term->cols < L'\x01') {
      local_7c = L'\0';
    }
    else {
      local_7c = term->cols;
    }
    for (local_5c = local_7c; local_5c < local_18; local_5c = local_5c + L'\x01') {
      term->tabs[local_5c] = local_5c % 8 == 0;
    }
    if ((term->savecurs).y < L'\0') {
      (term->savecurs).y = L'\0';
    }
    if (newsavelines_local <= (term->savecurs).y) {
      (term->savecurs).y = newsavelines_local + L'\xffffffff';
    }
    if (local_18 <= (term->savecurs).x) {
      (term->savecurs).x = local_18 + L'\xffffffff';
    }
    if ((term->alt_savecurs).y < L'\0') {
      (term->alt_savecurs).y = L'\0';
    }
    if (newsavelines_local <= (term->alt_savecurs).y) {
      (term->alt_savecurs).y = newsavelines_local + L'\xffffffff';
    }
    if (local_18 <= (term->alt_savecurs).x) {
      (term->alt_savecurs).x = local_18 + L'\xffffffff';
    }
    if ((term->curs).y < L'\0') {
      (term->curs).y = L'\0';
    }
    if (newsavelines_local <= (term->curs).y) {
      (term->curs).y = newsavelines_local + L'\xffffffff';
    }
    if (local_18 <= (term->curs).x) {
      (term->curs).x = local_18 + L'\xffffffff';
    }
    if (term->alt_y < L'\0') {
      term->alt_y = L'\0';
    }
    if (newsavelines_local <= term->alt_y) {
      term->alt_y = newsavelines_local + L'\xffffffff';
    }
    if (local_18 <= term->alt_x) {
      term->alt_x = local_18 + L'\xffffffff';
    }
    term->alt_y = L'\0';
    term->alt_x = L'\0';
    term->wrapnext = false;
    term->alt_wnext = false;
    term->rows = newsavelines_local;
    term->cols = local_18;
    term->savelines = newsavelines;
    swap_screen(term,which,false,false);
    term->win_scrollbar_update_pending = true;
    term_schedule_update(term);
    if (term->backend != (Backend *)0x0) {
      backend_size(term->backend,term->cols,term->rows);
    }
  }
  return;
}

Assistant:

void term_size(Terminal *term, int newrows, int newcols, int newsavelines)
{
    tree234 *newalt;
    termline **newdisp, *line;
    int i, j, oldrows = term->rows;
    int sblen;
    int save_alt_which = term->alt_which;

    if (newrows == term->rows && newcols == term->cols &&
        newsavelines == term->savelines)
        return;                        /* nothing to do */

    /* Behave sensibly if we're given zero (or negative) rows/cols */

    if (newrows < 1) newrows = 1;
    if (newcols < 1) newcols = 1;

    deselect(term);
    swap_screen(term, 0, false, false);

    term->alt_t = term->marg_t = 0;
    term->alt_b = term->marg_b = newrows - 1;

    if (term->rows == -1) {
        term->scrollback = newtree234(NULL);
        term->screen = newtree234(NULL);
        term->tempsblines = 0;
        term->rows = 0;
    }

    /*
     * Resize the screen and scrollback. We only need to shift
     * lines around within our data structures, because lineptr()
     * will take care of resizing each individual line if
     * necessary. So:
     *
     *  - If the new screen is longer, we shunt lines in from temporary
     *    scrollback if possible, otherwise we add new blank lines at
     *    the bottom.
     *
     *  - If the new screen is shorter, we remove any blank lines at
     *    the bottom if possible, otherwise shunt lines above the cursor
     *    to scrollback if possible, otherwise delete lines below the
     *    cursor.
     *
     *  - Then, if the new scrollback length is less than the
     *    amount of scrollback we actually have, we must throw some
     *    away.
     */
    sblen = count234(term->scrollback);
    /* Do this loop to expand the screen if newrows > rows */
    assert(term->rows == count234(term->screen));
    while (term->rows < newrows) {
        if (term->tempsblines > 0) {
            compressed_scrollback_line *cline;
            /* Insert a line from the scrollback at the top of the screen. */
            assert(sblen >= term->tempsblines);
            cline = delpos234(term->scrollback, --sblen);
            line = decompressline(cline);
            sfree(cline);
            line->temporary = false;   /* reconstituted line is now real */
            term->tempsblines -= 1;
            addpos234(term->screen, line, 0);
            term->curs.y += 1;
            term->savecurs.y += 1;
            term->alt_y += 1;
            term->alt_savecurs.y += 1;
        } else {
            /* Add a new blank line at the bottom of the screen. */
            line = newtermline(term, newcols, false);
            addpos234(term->screen, line, count234(term->screen));
        }
        term->rows += 1;
    }
    /* Do this loop to shrink the screen if newrows < rows */
    while (term->rows > newrows) {
        if (term->curs.y < term->rows - 1) {
            /* delete bottom row, unless it contains the cursor */
            line = delpos234(term->screen, term->rows - 1);
            freetermline(line);
        } else {
            /* push top row to scrollback */
            line = delpos234(term->screen, 0);
            addpos234(term->scrollback, compressline(line), sblen++);
            freetermline(line);
            term->tempsblines += 1;
            term->curs.y -= 1;
            term->savecurs.y -= 1;
            term->alt_y -= 1;
            term->alt_savecurs.y -= 1;
        }
        term->rows -= 1;
    }
    assert(term->rows == newrows);
    assert(count234(term->screen) == newrows);

    /* Delete any excess lines from the scrollback. */
    while (sblen > newsavelines) {
        line = delpos234(term->scrollback, 0);
        sfree(line);
        sblen--;
    }
    if (sblen < term->tempsblines)
        term->tempsblines = sblen;
    assert(count234(term->scrollback) <= newsavelines);
    assert(count234(term->scrollback) >= term->tempsblines);
    term->disptop = 0;

    /* Make a new displayed text buffer. */
    newdisp = snewn(newrows, termline *);
    for (i = 0; i < newrows; i++) {
        newdisp[i] = newtermline(term, newcols, false);
        for (j = 0; j < newcols; j++)
            newdisp[i]->chars[j].attr = ATTR_INVALID;
    }
    if (term->disptext) {
        for (i = 0; i < oldrows; i++)
            freetermline(term->disptext[i]);
    }
    sfree(term->disptext);
    term->disptext = newdisp;
    term->dispcursx = term->dispcursy = -1;

    /* Make a new alternate screen. */
    newalt = newtree234(NULL);
    for (i = 0; i < newrows; i++) {
        line = newtermline(term, newcols, true);
        addpos234(newalt, line, i);
    }
    if (term->alt_screen) {
        while (NULL != (line = delpos234(term->alt_screen, 0)))
            freetermline(line);
        freetree234(term->alt_screen);
    }
    term->alt_screen = newalt;
    term->alt_sblines = 0;

    term->tabs = sresize(term->tabs, newcols, unsigned char);
    {
        int i;
        for (i = (term->cols > 0 ? term->cols : 0); i < newcols; i++)
            term->tabs[i] = (i % 8 == 0 ? true : false);
    }

    /* Check that the cursor positions are still valid. */
    if (term->savecurs.y < 0)
        term->savecurs.y = 0;
    if (term->savecurs.y >= newrows)
        term->savecurs.y = newrows - 1;
    if (term->savecurs.x >= newcols)
        term->savecurs.x = newcols - 1;
    if (term->alt_savecurs.y < 0)
        term->alt_savecurs.y = 0;
    if (term->alt_savecurs.y >= newrows)
        term->alt_savecurs.y = newrows - 1;
    if (term->alt_savecurs.x >= newcols)
        term->alt_savecurs.x = newcols - 1;
    if (term->curs.y < 0)
        term->curs.y = 0;
    if (term->curs.y >= newrows)
        term->curs.y = newrows - 1;
    if (term->curs.x >= newcols)
        term->curs.x = newcols - 1;
    if (term->alt_y < 0)
        term->alt_y = 0;
    if (term->alt_y >= newrows)
        term->alt_y = newrows - 1;
    if (term->alt_x >= newcols)
        term->alt_x = newcols - 1;
    term->alt_x = term->alt_y = 0;
    term->wrapnext = false;
    term->alt_wnext = false;

    term->rows = newrows;
    term->cols = newcols;
    term->savelines = newsavelines;

    swap_screen(term, save_alt_which, false, false);

    term->win_scrollbar_update_pending = true;
    term_schedule_update(term);
    if (term->backend)
        backend_size(term->backend, term->cols, term->rows);
}